

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_35::encode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view s_local;
  
  (anonymous_namespace)::(anonymous_namespace)::
  encode_uri_helper<mjs::(anonymous_namespace)::encode_uri(mjs::gc_heap_ptr<mjs::global_object>const&,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>)::__0>
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,global,s._M_len,s._M_str);
  return __return_storage_ptr__;
}

Assistant:

value encode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    return encode_uri_helper(global, s, [](int ch) { return is_uri_unescaped(ch) || is_uri_reserved(ch) || ch == '#'; } );
}